

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_hatetarget.cpp
# Opt level: O3

void __thiscall AHateTarget::BeginPlay(AHateTarget *this)

{
  ushort uVar1;
  int iVar2;
  
  AActor::BeginPlay(&this->super_AActor);
  uVar1 = (this->super_AActor).SpawnAngle;
  if (uVar1 == 0) {
    (this->super_AActor).special2 = 1;
    iVar2 = 0xf4241;
  }
  else {
    iVar2 = (uint)uVar1 * 10;
  }
  (this->super_AActor).health = iVar2;
  return;
}

Assistant:

void AHateTarget::BeginPlay()
{
	Super::BeginPlay();
	if (SpawnAngle != 0)
	{	// Each degree translates into 10 units of health
		health = SpawnAngle * 10;
	}
	else
	{
		special2 = 1;
		health = 1000001;
	}
}